

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O3

void __thiscall DNSResolver::ChangetoDnsNameFormat(DNSResolver *this,uchar *dns,uchar *host)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uchar *__dest;
  undefined8 uStack_40;
  uchar auStack_38 [8];
  
  uStack_40 = 0x1040ac;
  sVar2 = strlen((char *)host);
  uVar5 = sVar2 + 0x10 & 0xfffffffffffffff0;
  lVar1 = -uVar5;
  __dest = auStack_38 + lVar1;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1040d1;
  strcpy((char *)__dest,(char *)host);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1040d9;
  sVar2 = strlen((char *)__dest);
  (__dest + sVar2)[0] = '.';
  (__dest + sVar2)[1] = '\0';
  if (auStack_38[-uVar5] != '\0') {
    uVar5 = 0;
    iVar4 = 0;
    do {
      if (__dest[uVar5] == '.') {
        *dns = (char)uVar5 - (char)iVar4;
        dns = dns + 1;
        uVar3 = (ulong)iVar4;
        if ((long)uVar3 < (long)uVar5) {
          do {
            *dns = __dest[uVar3];
            uVar3 = uVar3 + 1;
            dns = dns + 1;
            iVar4 = (int)uVar5;
          } while (uVar5 != uVar3);
        }
        iVar4 = iVar4 + 1;
      }
      uVar5 = uVar5 + 1;
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10412a;
      sVar2 = strlen((char *)__dest);
    } while (uVar5 < sVar2);
  }
  *dns = '\0';
  return;
}

Assistant:

void DNSResolver::ChangetoDnsNameFormat(unsigned char *dns, unsigned char *host) {
    int lock = 0, i;
    char tmp[strlen(reinterpret_cast<const char *>(host)) + 1];
    strcpy(tmp, reinterpret_cast<const char *>(host));
    strcat(tmp, ".");
    for (i = 0; i < strlen(tmp); i++) {
        if (tmp[i] == '.') {
            *dns++ = i - lock;
            for (; lock < i; lock++) {
                *dns++ = tmp[lock];
            }
            lock++; //or lock=i+1;
        }
    }
    *dns++ = '\0';
}